

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O2

Vec_Int_t *
Bmc_PerformISearch(Gia_Man_t *p,int nFramesMax,int nTimeOut,int fReverse,int fBackTopo,int fDump,
                  int fVerbose)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  
  if (fVerbose != 0) {
    pcVar1 = p->pName;
    uVar2 = Gia_ManAndNum(p);
    pcVar5 = "reverse";
    if (fReverse == 0) {
      pcVar5 = "direct";
    }
    pcVar6 = "backward";
    if (fBackTopo == 0) {
      pcVar6 = "natural";
    }
    printf("Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops with %s %s flop order:\n"
           ,pcVar1,(ulong)uVar2,(ulong)(uint)p->nRegs,pcVar5,pcVar6);
  }
  fflush(_stdout);
  p_00 = Vec_IntAlloc(p->vCos->nSize);
  for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
    iVar3 = Abc_Var2Lit(iVar7,0);
    Vec_IntPush(p_00,iVar3);
  }
  p_01 = (Vec_Int_t *)0x0;
  if (nFramesMax < 1) {
    nFramesMax = 0;
  }
  iVar7 = 1;
  while (iVar7 - nFramesMax != 1) {
    iVar3 = Bmc_PerformISearchOne(p,iVar7,nTimeOut,fReverse,fBackTopo,fVerbose,p_00);
    iVar7 = iVar7 + 1;
    if (iVar3 != 0) goto LAB_0049c1bd;
  }
  if (fDump != 0) {
    uVar2 = 0;
    for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
      iVar3 = Vec_IntEntry(p_00,iVar7);
      uVar4 = Abc_LitIsCompl(iVar3);
      uVar2 = uVar2 + (uVar4 ^ 1);
    }
    printf("The set contains %d (out of %d) next-state functions with 0-based numbers:\n",
           (ulong)uVar2);
    for (uVar2 = 0; (int)uVar2 < p->nRegs; uVar2 = uVar2 + 1) {
      iVar7 = Vec_IntEntry(p_00,uVar2);
      iVar7 = Abc_LitIsCompl(iVar7);
      if (iVar7 == 0) {
        printf("%d ",(ulong)uVar2);
      }
    }
    putchar(10);
  }
  p_01 = Vec_IntAlloc(p->nRegs);
  for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
    iVar3 = Vec_IntEntry(p_00,iVar7);
    uVar2 = Abc_LitIsCompl(iVar3);
    Vec_IntPush(p_01,uVar2 ^ 1);
  }
LAB_0049c1bd:
  Vec_IntFree(p_00);
  return p_01;
}

Assistant:

Vec_Int_t * Bmc_PerformISearch( Gia_Man_t * p, int nFramesMax, int nTimeOut, int fReverse, int fBackTopo, int fDump, int fVerbose )
{
    Vec_Int_t * vLits, * vFlops;
    int i, f;
    if ( fVerbose )
    printf( "Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops with %s %s flop order:\n",
        Gia_ManName(p), Gia_ManAndNum(p), Gia_ManRegNum(p), fReverse ? "reverse":"direct", fBackTopo ? "backward":"natural" );
    fflush( stdout );

    // collect positive literals
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(i, 0) );

    for ( f = 1; f <= nFramesMax; f++ )
        if ( Bmc_PerformISearchOne( p, f, nTimeOut, fReverse, fBackTopo, fVerbose, vLits ) )
        {
            Vec_IntFree( vLits );
            return NULL;
        }

    // dump the numbers of the flops
    if ( fDump )
    {
        int nLitsUsed = 0;
        for ( i = 0; i < Gia_ManRegNum(p); i++ )
            if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
                nLitsUsed++;
        printf( "The set contains %d (out of %d) next-state functions with 0-based numbers:\n", nLitsUsed, Gia_ManRegNum(p) );
        for ( i = 0; i < Gia_ManRegNum(p); i++ )
            if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
                printf( "%d ", i );
        printf( "\n" );
    }       
    // save flop indexes
    vFlops = Vec_IntAlloc( Gia_ManRegNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
            Vec_IntPush( vFlops, 1 );
        else
            Vec_IntPush( vFlops, 0 );
    Vec_IntFree( vLits );
    return vFlops;
}